

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::nextLogout(Session *this,Message *logout,UtcTimeStamp *timeStamp)

{
  SessionState *this_00;
  int iVar1;
  uchar *in_R8;
  size_t in_R9;
  allocator<char> local_31;
  string local_30;
  
  iVar1 = verify(this,(EVP_PKEY_CTX *)logout,(uchar *)0x0,0,in_R8,in_R9);
  if ((char)iVar1 != '\0') {
    this_00 = &this->m_state;
    if ((this->m_state).m_sentLogout == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Received logout request",&local_31);
      SessionState::onEvent(this_00,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
      generateLogout(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Sending logout response",&local_31);
      SessionState::onEvent(this_00,&local_30);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Received logout response",&local_31);
      SessionState::onEvent(this_00,&local_30);
    }
    std::__cxx11::string::~string((string *)&local_30);
    SessionState::incrNextTargetMsgSeqNum(this_00);
    if (this->m_resetOnLogout == true) {
      SessionState::reset(this_00);
    }
    disconnect(this);
  }
  return;
}

Assistant:

void Session::nextLogout( const Message& logout, const UtcTimeStamp& timeStamp )
{
  if ( !verify( logout, false, false ) ) return ;
  if ( !m_state.sentLogout() )
  {
    m_state.onEvent( "Received logout request" );
    generateLogout();
    m_state.onEvent( "Sending logout response" );
  }
  else
    m_state.onEvent( "Received logout response" );

  m_state.incrNextTargetMsgSeqNum();
  if ( m_resetOnLogout ) m_state.reset();
  disconnect();
}